

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

point3f tinyusdz::geometric_normal(point3f *p0,point3f *p1,point3f *p2)

{
  point3f pVar1;
  point3f local_90;
  point3f local_80;
  point3f local_70;
  point3f local_60;
  point3f local_50;
  undefined1 local_40 [8];
  point3f n;
  point3f *p2_local;
  point3f *p1_local;
  point3f *p0_local;
  
  unique0x10000090 = p2;
  pVar1 = operator-(p1,p0);
  local_60.z = pVar1.z;
  local_50.z = local_60.z;
  local_60._0_8_ = pVar1._0_8_;
  local_50.x = local_60.x;
  local_50.y = local_60.y;
  local_60 = pVar1;
  pVar1 = operator-(stack0xffffffffffffffd0,p0);
  local_80.z = pVar1.z;
  local_70.z = local_80.z;
  local_80._0_8_ = pVar1._0_8_;
  local_70.x = local_80.x;
  local_70.y = local_80.y;
  pVar1 = vcross(&local_50,&local_70);
  local_90.z = pVar1.z;
  n.x = local_90.z;
  local_90._0_8_ = pVar1._0_8_;
  local_40._0_4_ = local_90.x;
  local_40._4_4_ = local_90.y;
  pVar1 = vnormalize((point3f *)local_40,1.1920929e-07);
  return pVar1;
}

Assistant:

value::point3f geometric_normal(const value::point3f &p0, const value::point3f &p1, const value::point3f &p2)
{
  value::point3f n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}